

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O1

Vec_Int_t * Acec_TreeFindPoints(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Bit_t *vIgnore)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *vMap;
  int *__s;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  iVar2 = p->nObjs;
  iVar3 = iVar2 * 2;
  vMap = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar5 = iVar3;
  }
  vMap->nSize = 0;
  vMap->nCap = iVar5;
  if (iVar5 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar5 << 2);
  }
  vMap->pArray = __s;
  vMap->nSize = iVar3;
  if (__s != (int *)0x0) {
    memset(__s,0xff,(long)iVar2 << 3);
  }
  iVar2 = vAdds->nSize;
  if (0 < iVar2) {
    iVar3 = 0;
    uVar4 = 4;
    do {
      if (vIgnore == (Vec_Bit_t *)0x0) {
LAB_0067db56:
        Acec_TreeAddInOutPoint(vMap,vAdds->pArray[uVar4 - 4],iVar3,0);
        if (vAdds->nSize <= (int)(uVar4 - 3)) {
LAB_0067dc1d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        Acec_TreeAddInOutPoint(vMap,vAdds->pArray[uVar4 - 3],iVar3,0);
        if (vAdds->nSize <= (int)(uVar4 - 2)) goto LAB_0067dc1d;
        Acec_TreeAddInOutPoint(vMap,vAdds->pArray[uVar4 - 2],iVar3,0);
        if (vAdds->nSize <= (int)(uVar4 - 1)) goto LAB_0067dc1d;
        Acec_TreeAddInOutPoint(vMap,vAdds->pArray[uVar4 - 1],iVar3,1);
        if (vAdds->nSize <= (int)uVar4) goto LAB_0067dc1d;
        Acec_TreeAddInOutPoint(vMap,vAdds->pArray[uVar4],iVar3,1);
      }
      else {
        if (iVar2 <= (int)(uVar4 - 1)) goto LAB_0067dc1d;
        uVar1 = vAdds->pArray[uVar4 - 1];
        if (((int)uVar1 < 0) || (vIgnore->nSize <= (int)uVar1)) {
LAB_0067dc3c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if (((uint)vIgnore->pArray[uVar1 >> 5] >> (uVar1 & 0x1f) & 1) == 0) {
          if (iVar2 <= (int)uVar4) goto LAB_0067dc1d;
          uVar1 = vAdds->pArray[uVar4];
          if (((int)uVar1 < 0) || (vIgnore->nSize <= (int)uVar1)) goto LAB_0067dc3c;
          if (((uint)vIgnore->pArray[uVar1 >> 5] >> (uVar1 & 0x1f) & 1) == 0) goto LAB_0067db56;
        }
      }
      iVar2 = vAdds->nSize;
      iVar3 = iVar3 + 1;
      iVar5 = uVar4 + 2;
      uVar4 = uVar4 + 6;
    } while (iVar5 < iVar2);
  }
  return vMap;
}

Assistant:

Vec_Int_t * Acec_TreeFindPoints( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Bit_t * vIgnore )
{
    Vec_Int_t * vMap = Vec_IntStartFull( 2*Gia_ManObjNum(p) );
    int i;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
    {
        if ( vIgnore && (Vec_BitEntry(vIgnore, Vec_IntEntry(vAdds, 6*i+3)) || Vec_BitEntry(vIgnore, Vec_IntEntry(vAdds, 6*i+4))) )
            continue;
        Acec_TreeAddInOutPoint( vMap, Vec_IntEntry(vAdds, 6*i+0), i, 0 );
        Acec_TreeAddInOutPoint( vMap, Vec_IntEntry(vAdds, 6*i+1), i, 0 );
        Acec_TreeAddInOutPoint( vMap, Vec_IntEntry(vAdds, 6*i+2), i, 0 );
        Acec_TreeAddInOutPoint( vMap, Vec_IntEntry(vAdds, 6*i+3), i, 1 );
        Acec_TreeAddInOutPoint( vMap, Vec_IntEntry(vAdds, 6*i+4), i, 1 );
    }
    return vMap;
}